

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall
Matrix::CopyColumn(Matrix *this,Matrix *source_matrix,int source_column,int destination_column)

{
  long lVar1;
  bool bVar2;
  Fraction *pFVar3;
  long lVar4;
  long lVar5;
  bool local_44;
  
  if (this->n_ < 1) {
    local_44 = false;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    local_44 = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar4);
      pFVar3 = At(source_matrix,(int)lVar5,source_column);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)destination_column * 8),pFVar3);
      if (bVar2) {
        pFVar3 = At(source_matrix,(int)lVar5,source_column);
        *(Fraction *)
         (*(long *)((long)&(((this->elements_).
                             super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                           super__Vector_impl_data + lVar4) + (long)destination_column * 8) =
             *pFVar3;
        local_44 = true;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar5 < this->n_);
  }
  return local_44;
}

Assistant:

bool Matrix::CopyColumn(const Matrix& source_matrix, int source_column, int destination_column) {
  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][destination_column] != source_matrix.At(row, source_column)) {
      result = true;
      elements_[row][destination_column] = source_matrix.At(row, source_column);
    }
  }

  return result;
}